

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexHull.cpp
# Opt level: O2

bool chrono::utils::InBetween(ChVector2<double> *p1,ChVector2<double> *p2,ChVector2<double> *p3)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  
  dVar1 = p2->m_data[0];
  if ((dVar1 < p1->m_data[0]) || (bVar2 = true, p3->m_data[0] < dVar1)) {
    if (dVar1 <= p1->m_data[0]) {
      bVar2 = p3->m_data[0] <= dVar1;
    }
    else {
      bVar2 = false;
    }
  }
  dVar1 = p2->m_data[1];
  if ((dVar1 < p1->m_data[1]) || (bVar3 = true, p3->m_data[1] < dVar1)) {
    if (dVar1 <= p1->m_data[1]) {
      bVar3 = p3->m_data[1] <= dVar1;
    }
    else {
      bVar3 = false;
    }
  }
  return (bool)(bVar2 & bVar3);
}

Assistant:

bool InBetween(const ChVector2<>& p1, const ChVector2<>& p2, const ChVector2<>& p3) {
    bool a = (p2.x() >= p1.x() && p2.x() <= p3.x()) || (p2.x() <= p1.x() && p2.x() >= p3.x());
    bool b = (p2.y() >= p1.y() && p2.y() <= p3.y()) || (p2.y() <= p1.y() && p2.y() >= p3.y());
    return a && b;
}